

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::AttributeSelector>::moveAppend
          (QGenericArrayOps<QCss::AttributeSelector> *this,AttributeSelector *b,AttributeSelector *e
          )

{
  AttributeSelector *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pAVar1 = (this->super_QArrayDataPointer<QCss::AttributeSelector>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QCss::AttributeSelector>).size;
    do {
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pAVar1[qVar5].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pAVar1[qVar5].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pAVar1[qVar5].name.d.size = qVar4;
      pDVar2 = (b->value).d.d;
      (b->value).d.d = (Data *)0x0;
      pAVar1[qVar5].value.d.d = pDVar2;
      pcVar3 = (b->value).d.ptr;
      (b->value).d.ptr = (char16_t *)0x0;
      pAVar1[qVar5].value.d.ptr = pcVar3;
      qVar4 = (b->value).d.size;
      (b->value).d.size = 0;
      pAVar1[qVar5].value.d.size = qVar4;
      pAVar1[qVar5].valueMatchCriterium = b->valueMatchCriterium;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QCss::AttributeSelector>).size + 1;
      (this->super_QArrayDataPointer<QCss::AttributeSelector>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }